

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Validator::validateObject(Validator *this,uint8_t *ptr,size_t length)

{
  byte bVar1;
  byte *in_RSI;
  uint8_t head;
  size_t in_stack_00000050;
  uint8_t *in_stack_00000058;
  Validator *in_stack_00000060;
  size_t in_stack_00000230;
  uint8_t *in_stack_00000238;
  Validator *in_stack_00000240;
  
  bVar1 = *in_RSI;
  if (bVar1 == 0x14) {
    validateCompactObject(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  else if ((10 < bVar1) && (bVar1 < 0x13)) {
    validateIndexedObject(in_stack_00000240,in_stack_00000238,in_stack_00000230);
  }
  return;
}

Assistant:

void Validator::validateObject(uint8_t const* ptr, std::size_t length) {
  uint8_t head = *ptr;

  if (head == 0x14U) {
    // compact object
    validateCompactObject(ptr, length);
  } else if (head >= 0x0bU && head <= 0x12U) {
    // regular object
    validateIndexedObject(ptr, length);
  } else if (head == 0x0aU) {
    // empty object. always valid
  }
}